

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

_Bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  ALLEGRO_EVENT *pAVar1;
  long lVar2;
  ALLEGRO_EVENT *pAVar3;
  ALLEGRO_EVENT *pAVar4;
  byte bVar5;
  
  bVar5 = 0;
  heartbeat();
  _al_mutex_lock(&queue->mutex);
  pAVar1 = get_next_event_if_any(queue,false);
  if (pAVar1 != (ALLEGRO_EVENT *)0x0) {
    pAVar3 = pAVar1;
    pAVar4 = ret_event;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pAVar4 = *(undefined8 *)pAVar3;
      pAVar3 = (ALLEGRO_EVENT *)((long)pAVar3 + (ulong)bVar5 * -0x10 + 8);
      pAVar4 = (ALLEGRO_EVENT *)((long)pAVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    ref_if_user_event(ret_event);
  }
  _al_mutex_unlock(&queue->mutex);
  return pAVar1 != (ALLEGRO_EVENT *)0x0;
}

Assistant:

bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);
   ASSERT(ret_event);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, false);
   if (next_event) {
      copy_event(ret_event, next_event);
      ref_if_user_event(ret_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}